

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O1

int dprintf_formatf(void *data,_func_int_int_FILE_ptr *stream,char *format,__va_list_tag *ap_save)

{
  char *pcVar1;
  byte *__nptr;
  byte bVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  size_t sVar9;
  size_t sVar10;
  undefined1 *puVar11;
  uint uVar12;
  char *pcVar13;
  uint uVar14;
  int iVar15;
  undefined8 *puVar16;
  int *piVar17;
  ulong *puVar18;
  undefined8 *puVar19;
  ulong uVar20;
  long lVar21;
  uint *puVar22;
  int *piVar23;
  ulong uVar24;
  size_t maxlength;
  ulong uVar25;
  long lVar26;
  int unaff_R14D;
  int iVar27;
  ulong uVar28;
  byte *pbVar29;
  bool bVar30;
  char formatbuf [32];
  char work [256];
  va_stack_t vto [128];
  char *endpos [128];
  long local_15b8;
  undefined8 *local_1598;
  undefined8 *local_1590;
  long local_1588;
  undefined8 *local_1578;
  char *local_1570;
  __va_list_tag *local_1568;
  char *local_1560;
  undefined8 local_1558;
  undefined8 uStack_1550;
  undefined8 local_1548;
  undefined8 uStack_1540;
  undefined8 local_1538;
  undefined1 local_1439;
  int local_1438;
  undefined4 uStack_1434;
  undefined1 auStack_1430 [8];
  undefined8 uStack_1428;
  ulong uStack_1420;
  ulong auStack_1418 [508];
  undefined8 local_438 [129];
  
  bVar2 = *format;
  iVar15 = 0;
  local_1568 = ap_save;
  local_1538 = (byte *)format;
  if (bVar2 != 0) {
    unaff_R14D = 0x107004;
    local_15b8 = 0;
    puVar19 = local_438;
LAB_001024e1:
    pbVar29 = local_1538 + 1;
    while (local_1538 = pbVar29, puVar16 = puVar19, bVar2 == 0x25) {
      if (*local_1538 != 0x25) {
        iVar15 = iVar15 + 1;
        lVar8 = dprintf_DollarString((char *)local_1538,(char **)&local_1538);
        lVar21 = (long)iVar15;
        if (lVar8 != 0) {
          lVar21 = lVar8;
        }
        if (local_15b8 < lVar21) {
          local_15b8 = lVar21;
        }
        lVar8 = 0;
        local_1588 = 0;
        uVar14 = 0;
        pbVar29 = local_1538;
        goto switchD_00102589_caseD_1;
      }
      bVar2 = local_1538[1];
      pbVar29 = local_1538 + 2;
      if (bVar2 == 0) {
        local_1538 = local_1538 + 1;
        goto LAB_0010298f;
      }
    }
    goto LAB_00102971;
  }
  local_15b8 = 0;
LAB_0010298f:
  if (0 < local_15b8) {
    piVar23 = &local_1438;
    lVar21 = 1;
    do {
      if ((lVar21 < local_15b8) && (piVar23[8] == 9)) {
        uVar14 = local_1568->gp_offset;
        if ((ulong)uVar14 < 0x29) {
          piVar17 = (int *)((ulong)uVar14 + (long)local_1568->reg_save_area);
          local_1568->gp_offset = uVar14 + 8;
        }
        else {
          piVar17 = (int *)local_1568->overflow_arg_area;
          local_1568->overflow_arg_area = piVar17 + 2;
        }
        *(long *)(piVar23 + 0xe) = (long)*piVar17;
      }
      switch(*piVar23) {
      case 0:
      case 1:
      case 2:
      case 4:
switchD_00102a08_caseD_0:
        uVar14 = local_1568->gp_offset;
        if ((ulong)uVar14 < 0x29) {
          puVar18 = (ulong *)((ulong)uVar14 + (long)local_1568->reg_save_area);
          local_1568->gp_offset = uVar14 + 8;
        }
        else {
          puVar18 = (ulong *)local_1568->overflow_arg_area;
          local_1568->overflow_arg_area = puVar18 + 1;
        }
        uVar20 = *puVar18;
        goto LAB_00102a32;
      case 3:
        uVar14 = piVar23[1];
        if ((((~uVar14 & 0x240) == 0) || ((uVar14 & 0x40) != 0)) || ((~uVar14 & 0x220) == 0))
        goto switchD_00102a08_caseD_0;
        uVar12 = local_1568->gp_offset;
        uVar20 = (ulong)uVar12;
        if ((uVar14 & 0x20) == 0) {
          if ((uVar14 >> 9 & 1) == 0) {
            if (uVar12 < 0x29) {
              piVar17 = (int *)(uVar20 + (long)local_1568->reg_save_area);
              local_1568->gp_offset = uVar12 + 8;
            }
            else {
              piVar17 = (int *)local_1568->overflow_arg_area;
              local_1568->overflow_arg_area = piVar17 + 2;
            }
            uVar20 = (ulong)*piVar17;
          }
          else {
            if (uVar12 < 0x29) {
              puVar22 = (uint *)(uVar20 + (long)local_1568->reg_save_area);
              local_1568->gp_offset = uVar12 + 8;
            }
            else {
              puVar22 = (uint *)local_1568->overflow_arg_area;
              local_1568->overflow_arg_area = puVar22 + 2;
            }
            uVar20 = (ulong)*puVar22;
          }
        }
        else {
          if (uVar12 < 0x29) {
            puVar18 = (ulong *)((long)local_1568->reg_save_area + uVar20);
            local_1568->gp_offset = uVar12 + 8;
          }
          else {
            puVar18 = (ulong *)local_1568->overflow_arg_area;
            local_1568->overflow_arg_area = puVar18 + 1;
          }
          uVar20 = *puVar18;
        }
LAB_00102a32:
        *(ulong *)(piVar23 + 6) = uVar20;
        break;
      case 7:
        uVar14 = local_1568->fp_offset;
        if ((ulong)uVar14 < 0xa1) {
          puVar19 = (undefined8 *)((ulong)uVar14 + (long)local_1568->reg_save_area);
          local_1568->fp_offset = uVar14 + 0x10;
        }
        else {
          puVar19 = (undefined8 *)local_1568->overflow_arg_area;
          local_1568->overflow_arg_area = puVar19 + 1;
        }
        *(undefined8 *)(piVar23 + 6) = *puVar19;
        break;
      case 9:
        *piVar23 = 3;
      }
      piVar23 = piVar23 + 8;
      bVar30 = lVar21 != local_15b8;
      lVar21 = lVar21 + 1;
    } while (bVar30);
  }
  local_1590 = local_438;
  local_1588 = 0;
  iVar15 = 0;
  local_1560 = "0123456789abcdefghijklmnopqrstuvwxyz";
  local_1570 = format;
  local_1568 = (__va_list_tag *)local_1590;
LAB_00102b75:
  iVar27 = unaff_R14D;
  if (*local_1570 != '%') {
    pcVar13 = local_1570;
    if (*local_1570 == '\0') {
      return iVar15;
    }
    do {
      iVar4 = (*stream)((int)*pcVar13,(FILE *)data);
      if (iVar4 == -1) {
        uVar14 = 1;
        local_1570 = pcVar13;
        iVar27 = iVar15;
        goto LAB_00102ea2;
      }
      iVar15 = iVar15 + 1;
      pcVar1 = pcVar13 + 1;
      pcVar13 = pcVar13 + 1;
    } while ((*pcVar1 != '\0') && (*pcVar1 != '%'));
    uVar14 = 0;
    local_1570 = pcVar13;
    goto LAB_00102ea2;
  }
  pcVar13 = local_1570 + 1;
  if (local_1570[1] == '%') {
    local_1570 = local_1570 + 2;
    iVar4 = (*stream)(0x25,(FILE *)data);
    if (iVar4 == -1) {
      uVar14 = 1;
      iVar27 = iVar15;
    }
    else {
      uVar14 = 0;
      iVar15 = iVar15 + 1;
    }
    goto LAB_00102ea2;
  }
  local_1570 = pcVar13;
  lVar8 = dprintf_DollarString(pcVar13,&local_1570);
  lVar21 = lVar8 + -1;
  if (lVar8 == 0) {
    lVar21 = local_1588;
  }
  lVar8 = lVar21 * 0x20;
  puVar18 = (ulong *)(auStack_1430 + lVar8);
  uVar14 = *(uint *)(auStack_1430 + lVar8 + -4);
  if ((uVar14 >> 0xe & 1) != 0) {
    puVar18 = auStack_1418 + *puVar18 * 4 + -1;
  }
  uVar20 = *puVar18;
  if ((uVar14 >> 0x10 & 1) == 0) {
    local_1588 = local_1588 + 1;
    uVar24 = 0xffffffffffffffff;
    if ((short)uVar14 < 0) {
      uVar24 = (&uStack_1428)[lVar21 * 4];
    }
  }
  else {
    uVar24 = auStack_1418[(&uStack_1428)[lVar21 * 4] * 4 + -1];
    local_1588 = local_1588 + 2;
  }
  iVar4 = iVar15;
  if (6 < (&local_1438)[lVar21 * 8] - 1U) goto switchD_00102cba_caseD_5;
  uVar12 = uVar14 >> 3 & 1;
  iVar5 = (int)uVar20;
  switch((&local_1438)[lVar21 * 8]) {
  case 1:
    pcVar13 = (char *)auStack_1418[lVar21 * 4 + -1];
    if (pcVar13 == (char *)0x0) {
      if (uVar24 == 0xffffffffffffffff || 4 < (long)uVar24) {
        *(uint *)(auStack_1430 + lVar8 + -4) = uVar14 & 0xfffffff7;
        uVar25 = 5;
        pcVar13 = "(nil)";
      }
      else {
        pcVar13 = "";
        uVar25 = 0;
      }
    }
    else {
      uVar25 = strlen(pcVar13);
    }
    uVar28 = uVar25;
    if (uVar24 < uVar25) {
      uVar28 = uVar24;
    }
    if (uVar24 == 0xffffffffffffffff) {
      uVar28 = uVar25;
    }
    if ((auStack_1430[lVar8 + -4] & 8) != 0) {
      iVar4 = (*stream)(0x22,(FILE *)data);
      if (iVar4 == -1) {
LAB_00103255:
        bVar30 = false;
        iVar27 = iVar15;
        break;
      }
      iVar15 = iVar15 + 1;
    }
    lVar21 = uVar20 - uVar28;
    if ((auStack_1430[lVar8 + -4] & 4) == 0) {
      if (lVar21 < 1) {
        lVar21 = lVar21 + -1;
      }
      else {
        iVar5 = iVar5 + iVar15;
        do {
          iVar4 = (*stream)(0x20,(FILE *)data);
          if (iVar4 == -1) goto LAB_00103255;
          iVar15 = iVar15 + 1;
          lVar7 = lVar21 + -1;
          bVar30 = 0 < lVar21;
          lVar21 = lVar7;
        } while (lVar7 != 0 && bVar30);
        lVar21 = -1;
        iVar15 = iVar5 - (int)uVar28;
      }
    }
    iVar4 = iVar15;
    if (uVar28 != 0) {
      iVar4 = (int)uVar28 + iVar15;
      uVar20 = 0;
      do {
        iVar5 = (*stream)((int)pcVar13[uVar20],(FILE *)data);
        if (iVar5 == -1) {
          iVar15 = iVar15 + (int)uVar20;
          goto LAB_00103255;
        }
        uVar20 = uVar20 + 1;
      } while (uVar28 != uVar20);
    }
    iVar15 = iVar4;
    if (((auStack_1430[lVar8 + -4] & 4) != 0) && (0 < lVar21)) {
      lVar7 = lVar21 + 1;
      iVar5 = iVar4;
      do {
        iVar15 = iVar5;
        iVar5 = (*stream)(0x20,(FILE *)data);
        if (iVar5 == -1) goto LAB_00103266;
        iVar5 = iVar15 + 1;
        lVar7 = lVar7 + -1;
        iVar15 = (int)lVar21 + iVar4;
      } while (1 < lVar7);
    }
    bVar30 = true;
    if ((auStack_1430[lVar8 + -4] & 8) != 0) {
      iVar4 = (*stream)(0x22,(FILE *)data);
      if (iVar4 == -1) {
LAB_00103266:
        bVar30 = false;
        iVar27 = iVar15;
      }
      else {
        iVar15 = iVar15 + 1;
      }
    }
    break;
  case 2:
    if ((undefined8 *)auStack_1418[lVar21 * 4 + -1] == (undefined8 *)0x0) {
      if ((uVar14 & 4) == 0) {
        uVar25 = uVar20 - 5;
      }
      else {
        uVar25 = uVar20 - 6;
        if (5 < (long)uVar20) {
          iVar27 = iVar15 + -5;
          do {
            iVar4 = (*stream)(0x20,(FILE *)data);
            if (iVar4 == -1) goto LAB_001033ea;
            iVar15 = iVar15 + 1;
            bVar30 = 0 < (long)uVar25;
            uVar25 = uVar25 - 1;
          } while (bVar30);
          uVar25 = 0xffffffffffffffff;
          iVar15 = iVar27 + iVar5;
        }
      }
      iVar27 = iVar15 + 5;
      cVar3 = '(';
      lVar21 = 0;
LAB_00103312:
      iVar4 = (*stream)((int)cVar3,(FILE *)data);
      if (iVar4 != -1) goto code_r0x00103322;
      iVar15 = iVar15 + (int)lVar21;
LAB_001033ea:
      unaff_R14D = iVar15;
      uVar14 = 1;
      iVar27 = unaff_R14D;
      goto LAB_001033f7;
    }
    local_1560 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
    if ((uVar14 >> 0xc & 1) == 0) {
      local_1560 = "0123456789abcdefghijklmnopqrstuvwxyz";
    }
    uVar14 = 0x16;
    local_1578 = (undefined8 *)0x10;
    local_1590 = (undefined8 *)0x0;
    uVar12 = 1;
    uVar25 = uVar20;
    local_1598 = (undefined8 *)auStack_1418[lVar21 * 4 + -1];
    iVar27 = iVar15;
    goto LAB_001033f7;
  case 3:
    local_1598 = (undefined8 *)auStack_1418[lVar21 * 4 + -1];
    if ((uVar14 >> 0x11 & 1) == 0) {
      if ((uVar14 >> 9 & 1) == 0) {
        if ((uVar14 >> 10 & 1) == 0) {
          if ((uVar14 >> 0xb & 1) == 0) {
            local_1578 = (undefined8 *)0xa;
            local_1590 = (undefined8 *)((ulong)local_1598 >> 0x3f);
            if ((long)local_1598 < 1) {
              local_1598 = (undefined8 *)-(long)local_1598;
            }
            goto LAB_00103406;
          }
          local_1560 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";
          if ((uVar14 >> 0xc & 1) == 0) {
            local_1560 = "0123456789abcdefghijklmnopqrstuvwxyz";
          }
          local_1578 = (undefined8 *)0x10;
        }
        else {
          local_1578 = (undefined8 *)0x8;
        }
        local_1590 = (undefined8 *)0x0;
      }
      else {
        local_1578 = (undefined8 *)0xa;
        local_1590 = (undefined8 *)0x0;
      }
      goto LAB_00103406;
    }
    if ((uVar14 & 4) == 0) {
      if ((long)uVar20 < 2) {
        uVar20 = uVar20 - 1;
      }
      else {
        iVar27 = iVar15 + -1;
        do {
          iVar4 = (*stream)(0x20,(FILE *)data);
          if (iVar4 == -1) goto LAB_001033a4;
          iVar15 = iVar15 + 1;
          uVar20 = uVar20 - 1;
        } while (1 < (long)uVar20);
        uVar20 = 0;
        iVar15 = iVar27 + iVar5;
      }
    }
    iVar27 = (*stream)((uint)local_1598 & 0xff,(FILE *)data);
    uVar14 = 1;
    if (iVar27 == -1) {
LAB_001033a4:
      uVar14 = 1;
      iVar27 = iVar15;
      goto LAB_00102ea2;
    }
    iVar27 = iVar15 + 1;
    iVar4 = iVar27;
    if (((auStack_1430[lVar8 + -4] & 4) != 0) && (1 < (long)uVar20)) {
      iVar4 = iVar15 + (int)uVar20;
      lVar21 = uVar20 + 1;
      do {
        iVar5 = (*stream)(0x20,(FILE *)data);
        iVar15 = iVar27;
        if (iVar5 == -1) goto LAB_00102ea2;
        iVar27 = iVar27 + 1;
        lVar21 = lVar21 + -1;
      } while (2 < lVar21);
    }
    goto LAB_00102e89;
  case 4:
    if ((uVar14 & 0x40) == 0) {
      if ((uVar14 & 0x20) == 0) {
        if ((uVar14 & 0x10) == 0) {
          *(int *)auStack_1418[lVar21 * 4 + -1] = iVar15;
        }
        else {
          *(short *)auStack_1418[lVar21 * 4 + -1] = (short)iVar15;
        }
      }
      else {
        *(long *)auStack_1418[lVar21 * 4 + -1] = (long)iVar15;
      }
      goto LAB_00102e89;
    }
    *(long *)auStack_1418[lVar21 * 4 + -1] = (long)iVar15;
  default:
switchD_00102cba_caseD_5:
    goto LAB_00102e89;
  case 7:
    local_1548 = 0;
    uStack_1540 = 0;
    local_1558 = 0x25;
    uStack_1550 = 0;
    sVar9 = strlen((char *)&local_1558);
    if ((uVar14 >> 0xd & 1) == 0) {
      uVar20 = 0xffffffffffffffff;
      if ((uVar14 >> 0xe & 1) != 0) {
        puVar18 = auStack_1418 + *(long *)(auStack_1430 + lVar8) * 4 + -1;
        goto LAB_00102eba;
      }
    }
    else {
      puVar18 = (ulong *)(auStack_1430 + lVar8);
LAB_00102eba:
      uVar20 = *puVar18;
    }
    if ((short)uVar14 < 0) {
      uVar24 = (&uStack_1428)[lVar21 * 4];
    }
    else {
      uVar24 = 0xffffffffffffffff;
      if ((uVar14 >> 0x10 & 1) != 0) {
        uVar24 = auStack_1418[(&uStack_1428)[lVar21 * 4] * 4 + -1];
      }
    }
    if ((uVar14 & 4) != 0) {
      sVar10 = strlen((char *)&local_1558);
      *(undefined2 *)((long)&local_1558 + sVar10) = 0x2d;
    }
    if ((uVar14 & 2) != 0) {
      sVar10 = strlen((char *)&local_1558);
      *(undefined2 *)((long)&local_1558 + sVar10) = 0x2b;
    }
    if ((uVar14 & 1) != 0) {
      sVar10 = strlen((char *)&local_1558);
      *(undefined2 *)((long)&local_1558 + sVar10) = 0x20;
    }
    if ((uVar14 & 8) != 0) {
      sVar10 = strlen((char *)&local_1558);
      *(undefined2 *)((long)&local_1558 + sVar10) = 0x23;
    }
    maxlength = 0x20 - sVar9;
    sVar9 = strlen((char *)&local_1558);
    pbVar29 = (byte *)((long)&local_1558 + sVar9);
    if (-1 < (long)uVar20) {
      iVar4 = curl_msnprintf((char *)pbVar29,maxlength,"%ld",uVar20);
      pbVar29 = pbVar29 + iVar4;
      maxlength = maxlength - (long)iVar4;
    }
    if (-1 < (long)uVar24) {
      iVar4 = curl_msnprintf((char *)pbVar29,maxlength,".%ld");
      pbVar29 = pbVar29 + iVar4;
    }
    if ((auStack_1430[lVar8 + -4] & 0x20) != 0) {
      *pbVar29 = 0x6c;
      pbVar29 = pbVar29 + 1;
    }
    uVar14 = *(uint *)(auStack_1430 + lVar8 + -4);
    if ((uVar14 >> 0x12 & 1) == 0) {
      bVar2 = 0x66;
      if ((uVar14 >> 0x13 & 1) != 0) {
        bVar2 = ((uVar14 >> 0xc & 1) == 0) << 5 | 0x47;
      }
    }
    else {
      bVar2 = ((uVar14 >> 0xc & 1) == 0) << 5 | 0x45;
    }
    *pbVar29 = bVar2;
    pbVar29[1] = 0;
    sprintf((char *)&local_1538,(char *)&local_1558,(int)auStack_1418[lVar21 * 4 + -1]);
    bVar30 = (char)local_1538 == '\0';
    if (!bVar30) {
      iVar4 = (*stream)((uint)local_1538 & 0xff,(FILE *)data);
      pcVar13 = (char *)((long)&local_1538 + 1);
      while (iVar27 = iVar15, iVar4 != -1) {
        iVar15 = iVar15 + 1;
        bVar30 = *pcVar13 == '\0';
        iVar27 = unaff_R14D;
        if (bVar30) break;
        iVar4 = (*stream)((int)*pcVar13,(FILE *)data);
        pcVar13 = pcVar13 + 1;
      }
    }
  }
  uVar14 = 1;
  iVar4 = iVar15;
  unaff_R14D = iVar27;
  if (bVar30) goto LAB_00102e89;
  goto LAB_00102ea2;
switchD_00102589_caseD_1:
  local_1538 = pbVar29;
  __nptr = local_1538;
  bVar2 = *local_1538;
  uVar12 = bVar2 - 0x20;
  if (((0x2f < uVar12) || ((0x900003ff6c09U >> ((ulong)uVar12 & 0x3f) & 1) == 0)) &&
     ((0x12 < bVar2 - 0x68 || ((0x40211U >> (bVar2 - 0x68 & 0x1f) & 1) == 0)))) goto LAB_001026ec;
  pbVar29 = local_1538 + 1;
  if (bVar2 < 0x4c) {
    switch((ulong)uVar12) {
    case 0:
      uVar14 = uVar14 | 1;
      break;
    case 3:
      uVar14 = uVar14 | 8;
      break;
    case 10:
      uVar14 = uVar14 | 0x4000;
      iVar15 = iVar15 + 1;
      local_1538 = pbVar29;
      lVar7 = dprintf_DollarString((char *)pbVar29,(char **)&local_1538);
      lVar8 = (long)iVar15;
      if (lVar7 != 0) {
        lVar8 = lVar7;
      }
      pbVar29 = local_1538;
      if (local_15b8 < lVar8) {
        local_15b8 = lVar8;
      }
      break;
    case 0xb:
      uVar14 = uVar14 | 2;
      break;
    case 0xd:
      uVar14 = uVar14 & 0xfffffefb | 4;
      break;
    case 0xe:
      if (*pbVar29 == 0x2a) {
        uVar14 = uVar14 | 0x18000;
        local_1538 = local_1538 + 2;
        iVar15 = iVar15 + 1;
        lVar7 = dprintf_DollarString((char *)local_1538,(char **)&local_1538);
        local_1588 = (long)iVar15;
        if (lVar7 != 0) {
          local_1588 = lVar7;
        }
        pbVar29 = local_1538;
        if (local_15b8 < local_1588) {
          local_15b8 = local_1588;
        }
      }
      else {
        uVar14 = uVar14 | 0x8000;
        local_1538 = pbVar29;
        local_1588 = strtol((char *)pbVar29,(char **)&local_1538,10);
        pbVar29 = local_1538;
      }
      break;
    case 0x10:
      uVar14 = uVar14 | (~uVar14 & 4) << 6;
    case 0x11:
    case 0x12:
    case 0x13:
    case 0x14:
    case 0x15:
    case 0x16:
    case 0x17:
    case 0x18:
    case 0x19:
      uVar14 = uVar14 | 0x2000;
      local_1538 = pbVar29;
      lVar8 = strtol((char *)__nptr,(char **)&local_1538,10);
      pbVar29 = local_1538;
    }
  }
  else if (bVar2 < 0x6c) {
    if (bVar2 == 0x4c) {
      uVar14 = uVar14 | 0x80;
    }
    else if (bVar2 == 0x4f) {
LAB_001026bc:
      uVar14 = uVar14 | 0x20;
    }
    else if (bVar2 == 0x68) {
      uVar14 = uVar14 | 0x10;
    }
  }
  else {
    if (bVar2 == 0x6c) {
      if ((uVar14 & 0x20) != 0) goto LAB_001026c4;
      goto LAB_001026bc;
    }
    if (bVar2 == 0x71) {
LAB_001026c4:
      uVar14 = uVar14 | 0x40;
    }
    else if (bVar2 == 0x7a) goto LAB_001026bc;
  }
  goto switchD_00102589_caseD_1;
LAB_001026ec:
  lVar21 = lVar21 + -1;
  if (bVar2 < 0x58) {
    if (bVar2 == 0x45) {
      (&local_1438)[lVar21 * 8] = 7;
      uVar14 = uVar14 | 0x41000;
      goto LAB_001028be;
    }
    if (bVar2 == 0x47) {
      (&local_1438)[lVar21 * 8] = 7;
      uVar14 = uVar14 | 0x81000;
      goto LAB_001028be;
    }
    if (bVar2 == 0x53) {
      uVar14 = uVar14 | 8;
      goto switchD_00102720_caseD_73;
    }
    goto switchD_00102720_caseD_68;
  }
  switch(bVar2) {
  case 99:
    (&local_1438)[lVar21 * 8] = 3;
    uVar14 = uVar14 | 0x20000;
    break;
  case 100:
  case 0x69:
    (&local_1438)[lVar21 * 8] = 3;
    break;
  case 0x65:
    (&local_1438)[lVar21 * 8] = 7;
    uVar14 = uVar14 | 0x40000;
    break;
  case 0x66:
    (&local_1438)[lVar21 * 8] = 7;
    break;
  case 0x67:
    (&local_1438)[lVar21 * 8] = 7;
    uVar14 = uVar14 | 0x80000;
    break;
  case 0x6e:
    (&local_1438)[lVar21 * 8] = 4;
    break;
  case 0x6f:
    (&local_1438)[lVar21 * 8] = 3;
    uVar14 = uVar14 | 0x400;
    break;
  case 0x70:
    (&local_1438)[lVar21 * 8] = 2;
    break;
  case 0x73:
switchD_00102720_caseD_73:
    (&local_1438)[lVar21 * 8] = 1;
    break;
  case 0x75:
    (&local_1438)[lVar21 * 8] = 3;
    uVar14 = uVar14 | 0x200;
    break;
  case 0x78:
    (&local_1438)[lVar21 * 8] = 3;
    uVar14 = uVar14 | 0x800;
    break;
  default:
    if (bVar2 == 0x58) {
      (&local_1438)[lVar21 * 8] = 3;
      uVar14 = uVar14 | 0x1800;
      break;
    }
  case 0x68:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x71:
  case 0x72:
  case 0x74:
  case 0x76:
  case 0x77:
switchD_00102720_caseD_68:
    (&local_1438)[lVar21 * 8] = 0;
  }
LAB_001028be:
  lVar7 = lVar21 * 0x20;
  *(uint *)(auStack_1430 + lVar7 + -4) = uVar14;
  *(long *)(auStack_1430 + lVar7) = lVar8;
  (&uStack_1428)[lVar21 * 4] = local_1588;
  if ((uVar14 >> 0xe & 1) != 0) {
    lVar21 = lVar8 + -1;
    *(long *)(auStack_1430 + lVar7) = lVar21;
    lVar8 = lVar21 * 0x20;
    (&local_1438)[lVar21 * 8] = 9;
    *(undefined8 *)(auStack_1430 + lVar8 + -4) = 0;
    *(undefined8 *)(auStack_1430 + lVar8 + 4) = 0;
    *(undefined4 *)((long)&uStack_1428 + lVar8 + 4) = 0;
  }
  if ((uVar14 >> 0x10 & 1) != 0) {
    local_1588 = local_1588 + -1;
    (&uStack_1428)[lVar21 * 4] = local_1588;
    lVar21 = local_1588 * 0x20;
    (&local_1438)[local_1588 * 8] = 9;
    *(undefined8 *)(auStack_1430 + lVar21 + -4) = 0;
    *(undefined8 *)(auStack_1430 + lVar21 + 4) = 0;
    *(undefined4 *)((long)&uStack_1428 + lVar21 + 4) = 0;
  }
  *puVar19 = local_1538 + 1;
  puVar16 = puVar19 + 1;
  local_1598 = puVar19;
LAB_00102971:
  bVar2 = *local_1538;
  puVar19 = puVar16;
  if (bVar2 == 0) goto LAB_0010298f;
  goto LAB_001024e1;
code_r0x00103322:
  cVar3 = "(nil)"[lVar21 + 1];
  lVar21 = lVar21 + 1;
  if (lVar21 == 5) goto code_r0x00103337;
  goto LAB_00103312;
code_r0x00103337:
  uVar14 = 0;
  if ((auStack_1430[lVar8 + -4] & 4) == 0) {
    if ((long)uVar25 < 1) {
      uVar25 = uVar25 - 1;
    }
    else {
      iVar4 = (int)uVar25;
      do {
        iVar5 = (*stream)(0x20,(FILE *)data);
        if (iVar5 == -1) {
          uVar14 = 1;
          uVar25 = uVar25 - 1;
          unaff_R14D = iVar27;
          goto LAB_001033f7;
        }
        iVar27 = iVar27 + 1;
        uVar20 = uVar25 - 1;
        bVar30 = 0 < (long)uVar25;
        uVar25 = uVar20;
      } while (uVar20 != 0 && bVar30);
      uVar25 = 0xffffffffffffffff;
      iVar27 = iVar15 + iVar4 + 5;
    }
  }
LAB_001033f7:
  iVar15 = iVar27;
  iVar4 = iVar15;
  if (uVar14 != 0) {
    uVar20 = uVar25;
    iVar27 = unaff_R14D;
    if (uVar14 != 0x16) goto LAB_00102ea2;
LAB_00103406:
    if (uVar24 == 0xffffffffffffffff) {
      uVar24 = 1;
    }
    lVar21 = 0xff;
    if (local_1598 == (undefined8 *)0x0) {
      puVar11 = &local_1439;
    }
    else {
      do {
        lVar7 = lVar21;
        *(char *)((long)&local_1538 + lVar7) = local_1560[(ulong)local_1598 % (ulong)local_1578];
        lVar21 = lVar7 + -1;
        bVar30 = local_1578 <= local_1598;
        local_1598 = (undefined8 *)((ulong)local_1598 / (ulong)local_1578);
      } while (bVar30);
      puVar11 = (undefined1 *)((long)&uStack_1540 + lVar7 + 7);
    }
    lVar26 = uVar20 - (0xff - lVar21);
    sVar9 = uVar24 - (0xff - lVar21);
    lVar7 = lVar21;
    if (((uVar12 != 0) && (local_1578 == (undefined8 *)0x8)) && ((long)sVar9 < 1)) {
      *puVar11 = 0x30;
      lVar26 = lVar26 + -1;
      lVar7 = lVar21 + -1;
    }
    if (0 < (long)sVar9) {
      lVar7 = lVar7 - (uVar24 + lVar21);
      memset((void *)((long)&local_1438 + lVar7),0x30,sVar9);
      lVar26 = lVar26 - sVar9;
      lVar7 = lVar7 + 0xff;
    }
    bVar2 = local_1578 == (undefined8 *)0x10 & (byte)uVar12;
    lVar21 = lVar26 + -2;
    if (bVar2 == 0) {
      lVar21 = lVar26;
    }
    if (((int)local_1590 != 0) || ((auStack_1430[lVar8 + -4] & 3) != 0)) {
      lVar21 = lVar21 + -1;
    }
    if ((*(ushort *)(auStack_1430 + lVar8 + -4) & 0x104) == 0) {
      if (lVar21 < 1) {
        lVar21 = lVar21 + -1;
      }
      else {
        iVar4 = (int)lVar21;
        iVar27 = iVar15;
        do {
          iVar5 = (*stream)(0x20,(FILE *)data);
          if (iVar5 == -1) goto LAB_001036a4;
          iVar27 = iVar27 + 1;
          lVar26 = lVar21 + -1;
          bVar30 = 0 < lVar21;
          lVar21 = lVar26;
        } while (lVar26 != 0 && bVar30);
        lVar21 = -1;
        iVar15 = iVar4 + iVar15;
      }
    }
    if ((int)local_1590 == 0) {
      if ((*(uint *)(auStack_1430 + lVar8 + -4) & 2) != 0) {
        iVar27 = 0x2b;
        goto LAB_00103570;
      }
      if ((*(uint *)(auStack_1430 + lVar8 + -4) & 1) != 0) {
        iVar27 = 0x20;
        goto LAB_00103570;
      }
LAB_00103587:
      if (bVar2 == 0) {
LAB_001035e6:
        if ((*(uint *)(auStack_1430 + lVar8 + -4) & 0x104) == 0x100) {
          if (lVar21 < 1) {
            lVar21 = lVar21 + -1;
          }
          else {
            iVar4 = (int)lVar21 + iVar15;
            do {
              iVar5 = (*stream)(0x30,(FILE *)data);
              iVar27 = iVar15;
              if (iVar5 == -1) goto LAB_001036a4;
              iVar15 = iVar15 + 1;
              lVar26 = lVar21 + -1;
              bVar30 = 0 < lVar21;
              lVar21 = lVar26;
            } while (lVar26 != 0 && bVar30);
            lVar21 = -1;
            iVar15 = iVar4;
          }
        }
        if (lVar7 < 0xff) {
          lVar7 = lVar7 + -1;
          do {
            iVar4 = (*stream)((int)*(undefined1 *)((long)&local_1538 + lVar7 + 2),(FILE *)data);
            iVar27 = iVar15;
            if (iVar4 == -1) goto LAB_001036a4;
            iVar15 = iVar15 + 1;
            lVar7 = lVar7 + 1;
          } while (lVar7 < 0xfe);
        }
        bVar30 = true;
        iVar27 = unaff_R14D;
        iVar4 = iVar15;
        if (((auStack_1430[lVar8 + -4] & 4) != 0) && (bVar30 = true, 0 < lVar21)) {
          iVar5 = (int)lVar21 + iVar15;
          lVar21 = lVar21 + 1;
          do {
            iVar6 = (*stream)(0x20,(FILE *)data);
            bVar30 = iVar6 != -1;
            iVar27 = iVar15;
            iVar4 = iVar15;
            if (iVar6 == -1) break;
            iVar15 = iVar15 + 1;
            lVar21 = lVar21 + -1;
            iVar27 = unaff_R14D;
            iVar4 = iVar5;
          } while (1 < lVar21);
        }
      }
      else {
        iVar4 = (*stream)(0x30,(FILE *)data);
        iVar27 = iVar15;
        if (iVar4 == -1) goto LAB_001036a4;
        iVar27 = iVar15 + 1;
        if ((auStack_1430[lVar8 + -3] & 0x10) == 0) {
          iVar4 = 0x78;
        }
        else {
          iVar4 = 0x58;
        }
        iVar4 = (*stream)(iVar4,(FILE *)data);
        if (iVar4 != -1) {
          iVar15 = iVar15 + 2;
          goto LAB_001035e6;
        }
        bVar30 = false;
        iVar4 = iVar27;
      }
    }
    else {
      iVar27 = 0x2d;
LAB_00103570:
      iVar4 = (*stream)(iVar27,(FILE *)data);
      iVar27 = iVar15;
      if (iVar4 != -1) {
        iVar15 = iVar15 + 1;
        goto LAB_00103587;
      }
LAB_001036a4:
      bVar30 = false;
      iVar4 = iVar27;
    }
    uVar14 = 1;
    local_1598 = (undefined8 *)0x0;
    unaff_R14D = iVar27;
    if (!bVar30) {
      local_1598 = (undefined8 *)0x0;
      iVar15 = iVar4;
      goto LAB_00102ea2;
    }
  }
LAB_00102e89:
  local_1570 = *(char **)local_1568;
  local_1568 = (__va_list_tag *)((long)local_1568 + 8);
  uVar14 = 0;
  iVar27 = unaff_R14D;
  iVar15 = iVar4;
LAB_00102ea2:
  unaff_R14D = iVar27;
  if ((uVar14 & 0x1d) != 0) {
    return iVar27;
  }
  goto LAB_00102b75;
}

Assistant:

static int dprintf_formatf(
  void *data, /* untouched by format(), just sent to the stream() function in
                 the second argument */
  /* function pointer called for each output character */
  int (*stream)(int, FILE *),
  const char *format,    /* %-formatted string */
  va_list ap_save) /* list of parameters */
{
  /* Base-36 digits for numbers.  */
  const char *digits = lower_digits;

  /* Pointer into the format string.  */
  char *f;

  /* Number of characters written.  */
  int done = 0;

  long param; /* current parameter to read */
  long param_num=0; /* parameter counter */

  va_stack_t vto[MAX_PARAMETERS];
  char *endpos[MAX_PARAMETERS];
  char **end;

  char work[BUFFSIZE];

  va_stack_t *p;

  /* Do the actual %-code parsing */
  dprintf_Pass1(format, vto, endpos, ap_save);

  end = &endpos[0]; /* the initial end-position from the list dprintf_Pass1()
                       created for us */

  f = (char *)format;
  while(*f != '\0') {
    /* Format spec modifiers.  */
    int is_alt;

    /* Width of a field.  */
    long width;

    /* Precision of a field.  */
    long prec;

    /* Decimal integer is negative.  */
    int is_neg;

    /* Base of a number to be written.  */
    long base;

    /* Integral values to be written.  */
    mp_uintmax_t num;

    /* Used to convert negative in positive.  */
    mp_intmax_t signed_num;

    if(*f != '%') {
      /* This isn't a format spec, so write everything out until the next one
         OR end of string is reached.  */
      do {
        OUTCHAR(*f);
      } while(*++f && ('%' != *f));
      continue;
    }

    ++f;

    /* Check for "%%".  Note that although the ANSI standard lists
       '%' as a conversion specifier, it says "The complete format
       specification shall be `%%'," so we can avoid all the width
       and precision processing.  */
    if(*f == '%') {
      ++f;
      OUTCHAR('%');
      continue;
    }

    /* If this is a positional parameter, the position must follow immediately
       after the %, thus create a %<num>$ sequence */
    param=dprintf_DollarString(f, &f);

    if(!param)
      param = param_num;
    else
      --param;

    param_num++; /* increase this always to allow "%2$s %1$s %s" and then the
                    third %s will pick the 3rd argument */

    p = &vto[param];

    /* pick up the specified width */
    if(p->flags & FLAGS_WIDTHPARAM)
      width = (long)vto[p->width].data.num.as_signed;
    else
      width = p->width;

    /* pick up the specified precision */
    if(p->flags & FLAGS_PRECPARAM) {
      prec = (long)vto[p->precision].data.num.as_signed;
      param_num++; /* since the precision is extraced from a parameter, we
                      must skip that to get to the next one properly */
    }
    else if(p->flags & FLAGS_PREC)
      prec = p->precision;
    else
      prec = -1;

    is_alt = (p->flags & FLAGS_ALT) ? 1 : 0;

    switch (p->type) {
    case FORMAT_INT:
      num = p->data.num.as_unsigned;
      if(p->flags & FLAGS_CHAR) {
        /* Character.  */
        if(!(p->flags & FLAGS_LEFT))
          while(--width > 0)
            OUTCHAR(' ');
        OUTCHAR((char) num);
        if(p->flags & FLAGS_LEFT)
          while(--width > 0)
            OUTCHAR(' ');
        break;
      }
      if(p->flags & FLAGS_UNSIGNED) {
        /* Decimal unsigned integer.  */
        base = 10;
        goto unsigned_number;
      }
      if(p->flags & FLAGS_OCTAL) {
        /* Octal unsigned integer.  */
        base = 8;
        goto unsigned_number;
      }
      if(p->flags & FLAGS_HEX) {
        /* Hexadecimal unsigned integer.  */

        digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
        base = 16;
        goto unsigned_number;
      }

      /* Decimal integer.  */
      base = 10;

      is_neg = (p->data.num.as_signed < (mp_intmax_t)0) ? 1 : 0;
      if(is_neg) {
        /* signed_num might fail to hold absolute negative minimum by 1 */
        signed_num = p->data.num.as_signed + (mp_intmax_t)1;
        signed_num = -signed_num;
        num = (mp_uintmax_t)signed_num;
        num += (mp_uintmax_t)1;
      }

      goto number;

      unsigned_number:
      /* Unsigned number of base BASE.  */
      is_neg = 0;

      number:
      /* Number of base BASE.  */
      {
        char *workend = &work[sizeof(work) - 1];
        char *w;

        /* Supply a default precision if none was given.  */
        if(prec == -1)
          prec = 1;

        /* Put the number in WORK.  */
        w = workend;
        while(num > 0) {
          *w-- = digits[num % base];
          num /= base;
        }
        width -= (long)(workend - w);
        prec -= (long)(workend - w);

        if(is_alt && base == 8 && prec <= 0) {
          *w-- = '0';
          --width;
        }

        if(prec > 0) {
          width -= prec;
          while(prec-- > 0)
            *w-- = '0';
        }

        if(is_alt && base == 16)
          width -= 2;

        if(is_neg || (p->flags & FLAGS_SHOWSIGN) || (p->flags & FLAGS_SPACE))
          --width;

        if(!(p->flags & FLAGS_LEFT) && !(p->flags & FLAGS_PAD_NIL))
          while(width-- > 0)
            OUTCHAR(' ');

        if(is_neg)
          OUTCHAR('-');
        else if(p->flags & FLAGS_SHOWSIGN)
          OUTCHAR('+');
        else if(p->flags & FLAGS_SPACE)
          OUTCHAR(' ');

        if(is_alt && base == 16) {
          OUTCHAR('0');
          if(p->flags & FLAGS_UPPER)
            OUTCHAR('X');
          else
            OUTCHAR('x');
        }

        if(!(p->flags & FLAGS_LEFT) && (p->flags & FLAGS_PAD_NIL))
          while(width-- > 0)
            OUTCHAR('0');

        /* Write the number.  */
        while(++w <= workend) {
          OUTCHAR(*w);
        }

        if(p->flags & FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');
      }
      break;

    case FORMAT_STRING:
            /* String.  */
      {
        static const char null[] = "(nil)";
        const char *str;
        size_t len;

        str = (char *) p->data.str;
        if(str == NULL) {
          /* Write null[] if there's space.  */
          if(prec == -1 || prec >= (long) sizeof(null) - 1) {
            str = null;
            len = sizeof(null) - 1;
            /* Disable quotes around (nil) */
            p->flags &= (~FLAGS_ALT);
          }
          else {
            str = "";
            len = 0;
          }
        }
        else
          len = strlen(str);

        if(prec != -1 && (size_t) prec < len)
          len = (size_t)prec;
        width -= (long)len;

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');

        if(!(p->flags&FLAGS_LEFT))
          while(width-- > 0)
            OUTCHAR(' ');

        while(len-- > 0)
          OUTCHAR(*str++);
        if(p->flags&FLAGS_LEFT)
          while(width-- > 0)
            OUTCHAR(' ');

        if(p->flags & FLAGS_ALT)
          OUTCHAR('"');
      }
      break;

    case FORMAT_PTR:
      /* Generic pointer.  */
      {
        void *ptr;
        ptr = (void *) p->data.ptr;
        if(ptr != NULL) {
          /* If the pointer is not NULL, write it as a %#x spec.  */
          base = 16;
          digits = (p->flags & FLAGS_UPPER)? upper_digits : lower_digits;
          is_alt = 1;
          num = (size_t) ptr;
          is_neg = 0;
          goto number;
        }
        else {
          /* Write "(nil)" for a nil pointer.  */
          static const char strnil[] = "(nil)";
          const char *point;

          width -= (long)(sizeof(strnil) - 1);
          if(p->flags & FLAGS_LEFT)
            while(width-- > 0)
              OUTCHAR(' ');
          for(point = strnil; *point != '\0'; ++point)
            OUTCHAR(*point);
          if(! (p->flags & FLAGS_LEFT))
            while(width-- > 0)
              OUTCHAR(' ');
        }
      }
      break;

    case FORMAT_DOUBLE:
      {
        char formatbuf[32]="%";
        char *fptr;
        size_t left = sizeof(formatbuf)-strlen(formatbuf);
        int len;

        width = -1;
        if(p->flags & FLAGS_WIDTH)
          width = p->width;
        else if(p->flags & FLAGS_WIDTHPARAM)
          width = (long)vto[p->width].data.num.as_signed;

        prec = -1;
        if(p->flags & FLAGS_PREC)
          prec = p->precision;
        else if(p->flags & FLAGS_PRECPARAM)
          prec = (long)vto[p->precision].data.num.as_signed;

        if(p->flags & FLAGS_LEFT)
          strcat(formatbuf, "-");
        if(p->flags & FLAGS_SHOWSIGN)
          strcat(formatbuf, "+");
        if(p->flags & FLAGS_SPACE)
          strcat(formatbuf, " ");
        if(p->flags & FLAGS_ALT)
          strcat(formatbuf, "#");

        fptr=&formatbuf[strlen(formatbuf)];

        if(width >= 0) {
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, "%ld", width);
          fptr += len;
          left -= len;
        }
        if(prec >= 0) {
          /* RECURSIVE USAGE */
          len = curl_msnprintf(fptr, left, ".%ld", prec);
          fptr += len;
        }
        if(p->flags & FLAGS_LONG)
          *fptr++ = 'l';

        if(p->flags & FLAGS_FLOATE)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'E':'e');
        else if(p->flags & FLAGS_FLOATG)
          *fptr++ = (char)((p->flags & FLAGS_UPPER) ? 'G' : 'g');
        else
          *fptr++ = 'f';

        *fptr = 0; /* and a final zero termination */

        /* NOTE NOTE NOTE!! Not all sprintf() implementations returns number
           of output characters */
        (sprintf)(work, formatbuf, p->data.dnum);

        for(fptr=work; *fptr; fptr++)
          OUTCHAR(*fptr);
      }
      break;

    case FORMAT_INTPTR:
      /* Answer the count of characters written.  */
#ifdef HAVE_LONG_LONG_TYPE
      if(p->flags & FLAGS_LONGLONG)
        *(LONG_LONG_TYPE *) p->data.ptr = (LONG_LONG_TYPE)done;
      else
#endif
        if(p->flags & FLAGS_LONG)
          *(long *) p->data.ptr = (long)done;
      else if(!(p->flags & FLAGS_SHORT))
        *(int *) p->data.ptr = (int)done;
      else
        *(short *) p->data.ptr = (short)done;
      break;

    default:
      break;
    }
    f = *end++; /* goto end of %-code */

  }
  return done;
}